

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
* __thiscall
kj::_::
NullableValue<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
::operator=(NullableValue<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
            *this,NullableValue<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
                  *other)

{
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>
      ::~TupleImpl(&(this->field_1).value.impl);
    }
    if (other->isSet == true) {
      TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>
      ::TupleImpl(&(this->field_1).value.impl,&(other->field_1).value.impl);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }